

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginListBox(char *label,ImVec2 *size_arg)

{
  bool bVar1;
  ImVec2 *in_RSI;
  ImGuiWindowTempData *min;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImVec2 label_pos;
  ImRect bb;
  ImRect frame_bb;
  ImVec2 frame_size;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  undefined8 in_stack_ffffffffffffff00;
  ImGuiWindowFlags extra_flags;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float _x;
  char *in_stack_ffffffffffffff18;
  ImRect *bb_00;
  ImRect *min_00;
  undefined1 hide_text_after_hash;
  char *in_stack_ffffffffffffff38;
  ImVec2 in_stack_ffffffffffffff40;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImRect local_88;
  ImVec2 local_78;
  ImRect local_70;
  ImRect local_60;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  ImVec2 *local_18;
  bool local_1;
  
  local_20 = GImGui;
  local_18 = in_RSI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = &local_20->Style;
    local_34 = GetID(in_stack_fffffffffffffef0);
    local_3c = CalcTextSize(in_stack_ffffffffffffff18,
                            (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            SUB41((uint)in_stack_ffffffffffffff0c >> 0x18,0),
                            in_stack_ffffffffffffff08);
    local_60.Max = *local_18;
    fVar2 = CalcItemWidth();
    GetTextLineHeightWithSpacing();
    IVar4.y = in_stack_ffffffffffffff0c;
    IVar4.x = in_stack_ffffffffffffff08;
    local_4c = CalcItemSize(IVar4,(float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                            (float)in_stack_ffffffffffffff00);
    local_44 = ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    _x = local_44.x;
    fVar3 = ImMax<float>(local_44.y,local_3c.y);
    bb_00 = &local_60;
    ImVec2::ImVec2(&bb_00->Min,_x,fVar3);
    min = &local_28->DC;
    local_78 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                         (ImVec2 *)0x18c89e);
    ImRect::ImRect(&local_70,&min->CursorPos,&local_78);
    min_00 = &local_70;
    pIVar6 = &local_70.Max;
    if (local_3c.x <= 0.0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = (local_30->ItemInnerSpacing).x + local_3c.x;
    }
    pIVar5 = &local_98;
    ImVec2::ImVec2(pIVar5,fVar3,0.0);
    extra_flags = (ImGuiWindowFlags)((ulong)pIVar5 >> 0x20);
    local_90 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                         (ImVec2 *)0x18c943);
    ImRect::ImRect(&local_88,&min_00->Min,&local_90);
    hide_text_after_hash = (undefined1)((ulong)min_00 >> 0x38);
    ImGuiNextItemData::ClearFlags(&local_20->NextItemData);
    bVar1 = IsRectVisible((ImVec2 *)CONCAT44(_x,fVar2),
                          (ImVec2 *)CONCAT44(fVar3,in_stack_ffffffffffffff08));
    if (bVar1) {
      BeginGroup();
      if (0.0 < local_3c.x) {
        pIVar5 = &local_a8;
        ImVec2::ImVec2(pIVar5,local_70.Max.x + (local_30->ItemInnerSpacing).x,
                       local_70.Min.y + (local_30->FramePadding).y);
        RenderText(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(char *)pIVar6,
                   (bool)hide_text_after_hash);
        pIVar6 = &(local_28->DC).CursorMaxPos;
        operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                  (ImVec2 *)0x18ca85);
        IVar4 = ImMax(pIVar6,pIVar5);
        (local_28->DC).CursorMaxPos = IVar4;
      }
      ImRect::GetSize((ImRect *)CONCAT44(local_34,in_stack_fffffffffffffee8));
      BeginChildFrame((ImGuiID)_x,(ImVec2 *)CONCAT44(fVar3,in_stack_ffffffffffffff08),extra_flags);
      local_1 = true;
    }
    else {
      local_a0 = ImRect::GetSize((ImRect *)
                                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      ItemSize((ImVec2 *)CONCAT44(_x,fVar2),fVar3);
      ItemAdd(bb_00,(ImGuiID)_x,(ImRect *)CONCAT44(fVar3,in_stack_ffffffffffffff08));
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginListBox(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7.25 items.
    // Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = ImFloor(CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.25f + style.FramePadding.y * 2.0f));
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    // FIXME-OPT: We could omit the BeginGroup() if label_size.x but would need to omit the EndGroup() as well.
    BeginGroup();
    if (label_size.x > 0.0f)
    {
        ImVec2 label_pos = ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y);
        RenderText(label_pos, label);
        window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, label_pos + label_size);
    }

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}